

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O1

void __thiscall basisu::priority_queue::down_heap(priority_queue *this,uint32_t heap_index)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint32_t uVar4;
  entry *peVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (heap_index < (this->m_heap).m_size) {
    peVar5 = (this->m_heap).m_p;
    uVar4 = peVar5[heap_index].m_index;
    fVar2 = peVar5[heap_index].m_priority;
    uVar7 = heap_index * 2;
    uVar8 = this->m_size;
    if (uVar7 <= uVar8) {
      do {
        uVar6 = uVar7;
        if (uVar7 < uVar8) {
          uVar8 = (this->m_heap).m_size;
          if ((uVar8 <= uVar7) || (uVar9 = uVar7 | 1, uVar8 <= uVar9)) goto LAB_00242a73;
          peVar5 = (this->m_heap).m_p;
          fVar3 = peVar5[uVar9].m_priority;
          pfVar1 = &peVar5[uVar7].m_priority;
          if (*pfVar1 <= fVar3 && fVar3 != *pfVar1) {
            uVar6 = uVar9;
          }
        }
        uVar8 = (this->m_heap).m_size;
        if (uVar8 <= uVar6) goto LAB_00242a73;
        peVar5 = (this->m_heap).m_p;
        if (peVar5[uVar6].m_priority <= fVar2 && fVar2 != peVar5[uVar6].m_priority) break;
        if (uVar8 <= heap_index) goto LAB_00242a73;
        peVar5[heap_index] = peVar5[uVar6];
        uVar7 = uVar6 * 2;
        uVar8 = this->m_size;
        heap_index = uVar6;
      } while (uVar7 <= uVar8);
    }
    if (heap_index < (this->m_heap).m_size) {
      (this->m_heap).m_p[heap_index].m_index = uVar4;
      if (heap_index < (this->m_heap).m_size) {
        (this->m_heap).m_p[heap_index].m_priority = fVar2;
        return;
      }
    }
  }
LAB_00242a73:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,
                "T &basisu::vector<basisu::priority_queue::entry>::operator[](size_t) [T = basisu::priority_queue::entry]"
               );
}

Assistant:

inline void down_heap(uint32_t heap_index)
		{
			uint32_t orig_index = m_heap[heap_index].m_index;
			const float orig_priority = m_heap[heap_index].m_priority;

			uint32_t child_index;
			while ((child_index = (heap_index << 1)) <= m_size)
			{
				if ((child_index < m_size) && (m_heap[child_index].m_priority < m_heap[child_index + 1].m_priority)) ++child_index;
				if (orig_priority > m_heap[child_index].m_priority)
					break;
				m_heap[heap_index] = m_heap[child_index];
				heap_index = child_index;
			}

			m_heap[heap_index].m_index = orig_index;
			m_heap[heap_index].m_priority = orig_priority;
		}